

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O3

void duckdb::FirstVectorFunction<true,false>::Finalize<duckdb::FirstState<duckdb::string_t>>
               (FirstState<duckdb::string_t> *state,AggregateFinalizeData *finalize_data)

{
  OrderModifiers in_R9W;
  string_t sort_key;
  
  if ((state->is_set == true) && (state->is_null != true)) {
    sort_key.value.pointer.ptr = (char *)finalize_data->result;
    sort_key.value._0_8_ = (state->value).value.pointer.ptr;
    CreateSortKeyHelpers::DecodeSortKey
              (*(CreateSortKeyHelpers **)&(state->value).value,sort_key,
               (Vector *)finalize_data->result_idx,0x302,in_R9W);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, AggregateFinalizeData &finalize_data) {
		if (!state.is_set || state.is_null) {
			finalize_data.ReturnNull();
		} else {
			CreateSortKeyHelpers::DecodeSortKey(state.value, finalize_data.result, finalize_data.result_idx,
			                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
		}
	}